

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::get_timeseries_config_string_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Options *opts)

{
  bool bVar1;
  string tsopts;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"spot.timeseries(",(allocator<char> *)&local_50);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar1 = cali::ConfigManager::Options::is_set((Options *)this,"timeseries.metrics");
  if (bVar1) {
    cali::ConfigManager::Options::get_abi_cxx11_(&local_30,(Options *)this,"timeseries.metrics","");
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  anon_unknown.dwarf_4d3168::convert_timeseries_option
            ((Options *)this,"iteration_interval",&local_50);
  anon_unknown.dwarf_4d3168::convert_timeseries_option((Options *)this,"time_interval",&local_50);
  anon_unknown.dwarf_4d3168::convert_timeseries_option((Options *)this,"target_loops",&local_50);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string get_timeseries_config_string(const ConfigManager::Options& opts)
{
    std::string ret = "spot.timeseries(";
    std::string tsopts;

    if (opts.is_set("timeseries.metrics"))
        tsopts.append(opts.get("timeseries.metrics"));

    convert_timeseries_option(opts, "iteration_interval", tsopts);
    convert_timeseries_option(opts, "time_interval", tsopts);
    convert_timeseries_option(opts, "target_loops", tsopts);

    ret.append(tsopts);
    ret.append(")");

    return ret;
}